

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button,float lock_threshold)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 *mouse_pos;
  float fVar4;
  float fVar5;
  
  pIVar2 = GImGui;
  if (4 < (uint)button) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x13f5,"ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton, float)");
  }
  if (lock_threshold < 0.0) {
    lock_threshold = (GImGui->IO).MouseDragThreshold;
  }
  if ((GImGui->IO).MouseDown[(uint)button] == false) {
    fVar4 = 0.0;
    fVar5 = 0.0;
    if ((GImGui->IO).MouseReleased[(uint)button] != true) goto LAB_00135406;
  }
  fVar4 = 0.0;
  fVar5 = 0.0;
  if (lock_threshold * lock_threshold <= (GImGui->IO).MouseDragMaxDistanceSqr[(uint)button]) {
    bVar3 = IsMousePosValid(&(GImGui->IO).MousePos);
    if (bVar3) {
      mouse_pos = (pIVar2->IO).MouseClickedPos + (uint)button;
      bVar3 = IsMousePosValid(mouse_pos);
      fVar4 = 0.0;
      fVar5 = 0.0;
      if (bVar3) {
        fVar4 = (pIVar2->IO).MousePos.x - mouse_pos->x;
        fVar5 = (pIVar2->IO).MousePos.y - (pIVar2->IO).MouseClickedPos[(uint)button].y;
      }
    }
    else {
      fVar4 = 0.0;
      fVar5 = 0.0;
    }
  }
LAB_00135406:
  IVar1.y = fVar5;
  IVar1.x = fVar4;
  return IVar1;
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button] || g.IO.MouseReleased[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            if (IsMousePosValid(&g.IO.MousePos) && IsMousePosValid(&g.IO.MouseClickedPos[button]))
                return g.IO.MousePos - g.IO.MouseClickedPos[button];
    return ImVec2(0.0f, 0.0f);
}